

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-save.c
# Opt level: O0

ztresult_t
zt_save(ztstruct_t *metastruct,void *structure,char *filename,ztregion_t *regions,int nregions,
       ztsaver_t **savers,int nsavers)

{
  FILE *__stream;
  char *in_RDX;
  undefined8 in_R9;
  savestate_t state;
  ztresult_t rc;
  void *in_stack_000000a0;
  ztwalkhandlers_t *in_stack_000000a8;
  int in_stack_000000b4;
  ztregion_t *in_stack_000000b8;
  void *in_stack_000000c0;
  ztstruct_t *in_stack_000000c8;
  save_stack_t sStack_68;
  undefined8 local_50;
  ztresult_t local_3c;
  undefined8 local_38;
  ztresult_t local_4;
  
  local_38 = in_R9;
  __stream = fopen(in_RDX,"wb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0x50;
  }
  else {
    savestack_setup(&sStack_68);
    local_50 = local_38;
    local_3c = zt_walk(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,
                       in_stack_000000a8,in_stack_000000a0);
    if (local_3c == 0) {
      savestack_destroy((save_stack_t *)0x1035be);
      fclose(__stream);
      local_4 = 0;
    }
    else {
      savestack_destroy((save_stack_t *)0x1035dd);
      fclose(__stream);
      local_4 = local_3c;
    }
  }
  return local_4;
}

Assistant:

ztresult_t zt_save(const ztstruct_t  *metastruct,
                   const void        *structure,
                   const char        *filename,
                   const ztregion_t  *regions,
                   int                nregions,
                   ztsaver_t        **savers,
                   int                nsavers)
{
  static const ztwalkhandlers_t savehandlers =
  {
    savehandler_uchar,
    savehandler_ushort,
    savehandler_uint,
    savehandler_index,
    savehandler_version,
    savehandler_startstruct,
    savehandler_endstruct,
    savehandler_startarray,
    savehandler_endarray,
    savehandler_custom
  };

  ztresult_t  rc;
  savestate_t state;

  assert(metastruct);
  assert(structure);
  assert(filename);
  /* regions may be NULL */
  assert(nregions >= 0);
  /* savers may be NULL */
  assert(nsavers >= 0);

  state.f = fopen(filename, "wb");
  if (state.f == NULL)
    return ztresult_BAD_FOPEN;
  
  state.indent_is_due = 0;
  state.depth         = 0;
  savestack_setup(&state.stack);
  state.savers        = savers;
  state.nsavers       = nsavers;

  rc = zt_walk(metastruct, structure, regions, nregions, &savehandlers, &state);
  if (rc)
    goto err;

  savestack_destroy(&state.stack);
  fclose(state.f);

  return ztresult_OK;


err:
  savestack_destroy(&state.stack);
  fclose(state.f);

  return rc;
}